

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerFrame.hpp
# Opt level: O3

int __thiscall Husky::ServerFrame::init(ServerFrame *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  string local_30;
  
  bVar2 = BindToLocalHost(this,&this->m_lsnSock,this->m_nLsnPort);
  paVar1 = &local_30.field_2;
  local_30._M_dataplus._M_p = (pointer)paVar1;
  if (bVar2) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"init ok {port:%d, threadNum:%d}","");
    Limonp::Logger::LoggingF
              (1,"ServerFrame.hpp",0x51,&local_30,(ulong)this->m_nLsnPort,
               (ulong)this->m_nThreadCount);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    iVar3 = (*this->m_pHandler->_vptr_IRequestHandler[2])();
    if ((char)iVar3 != '\0') {
      return (int)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"m_pHandler init failed.","");
    Limonp::Logger::LoggingF(4,"ServerFrame.hpp",0x55,&local_30);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"BindToLocalHost failed.","");
    Limonp::Logger::LoggingF(4,"ServerFrame.hpp",0x4e,&local_30);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

virtual bool init()  
            {

                if (!BindToLocalHost(m_lsnSock,m_nLsnPort))
                {
                    LogFatal("BindToLocalHost failed.");
                    return false;
                }
                LogInfo("init ok {port:%d, threadNum:%d}", m_nLsnPort, m_nThreadCount);

                if(!m_pHandler->init())
                {
                    LogFatal("m_pHandler init failed.");
                    return false;
                }
                return true;
            }